

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionObject.cpp
# Opt level: O3

aphy_matrix3x3 * __thiscall
APhyBullet::BulletCollisionObject::getMatrix(BulletCollisionObject *this)

{
  btCollisionObject *pbVar1;
  aphy_vector3 aVar2;
  undefined1 auVar3 [12];
  aphy_vector3 aVar4;
  aphy_vector3 aVar5;
  aphy_matrix3x3 *in_RDI;
  
  pbVar1 = this->handle;
  auVar3 = SUB1612(*(undefined1 (*) [16])(pbVar1->m_worldTransform).m_basis.m_el[0].m_floats,0);
  aVar2.pad = 0.0;
  aVar2.x = (aphy_scalar)auVar3._0_4_;
  aVar2.y = (aphy_scalar)auVar3._4_4_;
  aVar2.z = (aphy_scalar)auVar3._8_4_;
  in_RDI->firstRow = aVar2;
  auVar3 = SUB1612(*(undefined1 (*) [16])(pbVar1->m_worldTransform).m_basis.m_el[1].m_floats,0);
  aVar4.pad = 0.0;
  aVar4.x = (aphy_scalar)auVar3._0_4_;
  aVar4.y = (aphy_scalar)auVar3._4_4_;
  aVar4.z = (aphy_scalar)auVar3._8_4_;
  in_RDI->secondRow = aVar4;
  auVar3 = SUB1612(*(undefined1 (*) [16])(pbVar1->m_worldTransform).m_basis.m_el[2].m_floats,0);
  aVar5.pad = 0.0;
  aVar5.x = (aphy_scalar)auVar3._0_4_;
  aVar5.y = (aphy_scalar)auVar3._4_4_;
  aVar5.z = (aphy_scalar)auVar3._8_4_;
  in_RDI->thirdRow = aVar5;
  return in_RDI;
}

Assistant:

aphy_matrix3x3 BulletCollisionObject::getMatrix()
{
    return convertMatrix(handle->getWorldTransform().getBasis());
}